

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O3

void Wlc_WinProfileArith(Wlc_Ntk_t *p)

{
  ushort *puVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vLeaves;
  int *piVar4;
  Vec_Int_t *vNodes;
  long lVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint iObj;
  uint uVar10;
  Wlc_Obj_t *pObj;
  
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 1000;
  vLeaves->nSize = 0;
  piVar4 = (int *)malloc(4000);
  vLeaves->pArray = piVar4;
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  piVar4 = (int *)malloc(4000);
  vNodes->pArray = piVar4;
  uVar10 = 0;
  if (1 < p->iObj) {
    lVar5 = 1;
    lVar8 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar5) goto LAB_0035988a;
      puVar1 = (ushort *)(&p->pObjs->field_0x0 + lVar8);
      *puVar1 = *puVar1 & 0xff7f;
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0x18;
    } while (lVar5 < p->iObj);
    uVar10 = 0;
    if (1 < p->iObj) {
      lVar5 = 1;
      uVar10 = 0;
      do {
        if (p->nObjsAlloc <= lVar5) goto LAB_0035988a;
        pObj = p->pObjs + lVar5;
        iVar3 = Wlc_ObjHasArithm_rec(p,pObj);
        if (iVar3 == 0) {
          iVar3 = Wlc_ObjHasArithmFanins(p,pObj);
          if (iVar3 != 0) goto LAB_00359717;
        }
        else if ((pObj->field_0x1 & 6) != 0) {
LAB_00359717:
          Wlc_WinCompute(p,pObj,vLeaves,vNodes);
          iVar3 = Wlc_ManCountArithmReal(p,vNodes);
          if (1 < iVar3) {
            iObj = (int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555;
            pcVar6 = Wlc_ObjName(p,iObj);
            printf("Arithmetic cone of node %d (%s):\n",(ulong)iObj,pcVar6);
            Wlc_NtkPrintNode(p,pObj);
            iVar3 = vNodes->nSize;
            if (1 < iVar3) {
              piVar4 = vNodes->pArray;
              iVar7 = -1;
              lVar8 = 0;
              do {
                iVar2 = piVar4[lVar8];
                piVar4[lVar8] = piVar4[iVar3 + iVar7];
                piVar4[vNodes->nSize + iVar7] = iVar2;
                lVar8 = lVar8 + 1;
                iVar3 = vNodes->nSize;
                iVar7 = iVar7 + -1;
              } while (lVar8 < iVar3 / 2);
            }
            Wlc_NtkPrintNodeArray(p,vNodes);
            putchar(10);
            uVar10 = uVar10 + 1;
          }
        }
        lVar5 = lVar5 + 1;
        iVar3 = p->iObj;
      } while (lVar5 < iVar3);
      if (1 < iVar3) {
        uVar9 = 1;
        if (1 < p->nObjsAlloc) {
          uVar9 = (ulong)(uint)p->nObjsAlloc;
        }
        lVar5 = 0x18;
        do {
          if (uVar9 * 0x18 == lVar5) {
LAB_0035988a:
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          if (((&p->pObjs->field_0x0)[lVar5] & 0x80) != 0) {
            __assert_fail("pObj->Mark == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcWin.c"
                          ,0x9a,"void Wlc_WinProfileArith(Wlc_Ntk_t *)");
          }
          lVar5 = lVar5 + 0x18;
        } while ((long)iVar3 * 0x18 != lVar5);
      }
    }
  }
  printf("Finished printing %d arithmetic cones.\n",(ulong)uVar10);
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  return;
}

Assistant:

void Wlc_WinProfileArith( Wlc_Ntk_t * p )
{
    Vec_Int_t * vLeaves = Vec_IntAlloc( 1000 );
    Vec_Int_t * vNodes  = Vec_IntAlloc( 1000 );
    Wlc_Obj_t * pObj; int i, Count = 0;
    Wlc_NtkForEachObj( p, pObj, i )
        pObj->Mark = 0;
    Wlc_NtkForEachObj( p, pObj, i )
        if ( Wlc_ObjHasArithm_rec(p, pObj) ? Wlc_ObjIsCo(pObj) : Wlc_ObjHasArithmFanins(p, pObj) )
        {
            Wlc_WinCompute( p, pObj, vLeaves, vNodes ); 
            if ( Wlc_ManCountArithmReal(p, vNodes) < 2 )
                continue;

            printf( "Arithmetic cone of node %d (%s):\n", Wlc_ObjId(p, pObj), Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
            Wlc_NtkPrintNode( p, pObj );
            Vec_IntReverseOrder( vNodes );
            Wlc_NtkPrintNodeArray( p, vNodes );
            printf( "\n" );
            Count++;
        }
    Wlc_NtkForEachObj( p, pObj, i )
        assert( pObj->Mark == 0 );
    printf( "Finished printing %d arithmetic cones.\n", Count );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vNodes );
}